

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

QVariant * __thiscall
QAbstractItemView::inputMethodQuery(QAbstractItemView *this,InputMethodQuery query)

{
  bool bVar1;
  int iVar2;
  QAbstractItemViewPrivate *pQVar3;
  int in_EDX;
  QVariant *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  QWidget *currentEditor;
  QAbstractItemViewPrivate *d;
  QVariant *result;
  QRect editorRect;
  QModelIndex current;
  QModelIndex *index;
  QAbstractItemViewPrivate *in_stack_fffffffffffffee8;
  QWidget *in_stack_fffffffffffffef0;
  InputMethodQuery query_00;
  QWidget *in_stack_fffffffffffffef8;
  QRect *local_c0;
  undefined1 *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  index = in_RDI;
  pQVar3 = d_func((QAbstractItemView *)0x801616);
  local_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  currentIndex((QAbstractItemView *)index);
  *(undefined1 **)index = &DAT_aaaaaaaaaaaaaaaa;
  index->i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  (index->m).ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)(index + 1) = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::QVariant((QVariant *)0x801694);
  bVar1 = QModelIndex::isValid(in_RDI);
  if (bVar1) {
    in_stack_fffffffffffffef8 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
    if ((pQVar3->waitForIMCommit & 1U) != 0) {
      QAbstractItemViewPrivate::editorForIndex(in_stack_fffffffffffffee8,index);
      in_stack_fffffffffffffef8 =
           ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x8016e5);
      if (in_stack_fffffffffffffef8 != (QWidget *)0x0) {
        (**(code **)(*(long *)in_stack_fffffffffffffef8 + 400))
                  (&local_28,in_stack_fffffffffffffef8,in_EDX);
        ::QVariant::operator=(in_RSI,(QVariant *)in_RDI);
        ::QVariant::~QVariant(&local_28);
        iVar2 = ::QVariant::typeId((QVariant *)in_RDI);
        if (iVar2 == 0x13) {
          ::QVariant::value<QRect>((QVariant *)0x801768);
          QRect::topLeft((QRect *)in_stack_fffffffffffffef8);
          QWidget::mapTo(in_stack_fffffffffffffef0,(QWidget *)in_stack_fffffffffffffee8,
                         (QPoint *)index);
          QRect::size((QRect *)index);
          QRect::QRect((QRect *)in_stack_fffffffffffffef0,(QPoint *)in_stack_fffffffffffffee8,
                       (QSize *)index);
          ::QVariant::QVariant(&local_48,local_c0);
          ::QVariant::operator=(in_RSI,(QVariant *)in_RDI);
          ::QVariant::~QVariant(&local_48);
        }
        goto LAB_0080186d;
      }
    }
    if (in_EDX == 2) {
      auVar4 = (**(code **)((in_RSI->d).data.shared + 0x1e0))(in_RSI,&local_a0);
      in_stack_fffffffffffffef0 = auVar4._8_8_;
      ::QVariant::QVariant(&local_68,auVar4._0_8_);
      ::QVariant::operator=(in_RSI,(QVariant *)in_RDI);
      ::QVariant::~QVariant(&local_68);
    }
  }
LAB_0080186d:
  query_00 = (InputMethodQuery)((ulong)in_stack_fffffffffffffef0 >> 0x20);
  bVar1 = ::QVariant::isValid((QVariant *)in_RDI);
  if (!bVar1) {
    QWidget::inputMethodQuery(in_stack_fffffffffffffef8,query_00);
    ::QVariant::operator=(in_RSI,(QVariant *)in_RDI);
    ::QVariant::~QVariant(&local_88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QAbstractItemView::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QAbstractItemView);
    const QModelIndex current = currentIndex();
    QVariant result;
    if (current.isValid()) {
        if (QWidget *currentEditor;
            d->waitForIMCommit && (currentEditor = d->editorForIndex(current).widget)) {
            // An editor is open but the initial preedit is still ongoing. Delegate
            // queries to the editor and map coordinates from editor to this view.
            result = currentEditor->inputMethodQuery(query);
            if (result.typeId() == QMetaType::QRect) {
                const QRect editorRect = result.value<QRect>();
                result = QRect(currentEditor->mapTo(this, editorRect.topLeft()), editorRect.size());
            }
        } else if (query == Qt::ImCursorRectangle) {
            result = visualRect(current);
        }
    }
    if (!result.isValid())
        result = QAbstractScrollArea::inputMethodQuery(query);
    return result;
}